

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O3

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::async_request<std::__cxx11::string,std::__cxx11::string>
          (coro_http_client *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uri,http_method method,
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *headers,span<char,_18446744073709551615UL> out_buf)

{
  size_type *psVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar2;
  http_header *phVar3;
  size_t *psVar4;
  char *pcVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  size_t sVar10;
  size_type sVar11;
  element_type *peVar12;
  char **ppcVar13;
  undefined4 in_register_00000014;
  size_t *psVar14;
  
  psVar14 = (size_t *)CONCAT44(in_register_00000014,method);
  peVar12 = (element_type *)operator_new(0x388,(nothrow_t *)&std::nothrow);
  if (peVar12 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar12->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         async_request<std::__cxx11::string,std::__cxx11::string>;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar12->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         async_request<std::__cxx11::string,std::__cxx11::string>;
    *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0x308) = out_buf._M_ptr._0_4_;
    *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0x30c) = out_buf._M_ptr._4_4_;
    *(undefined4 *)&((string_view *)((long)(peVar12->parser_).headers_._M_elems + 0x310))->_M_len =
         (undefined4)out_buf._M_extent._M_extent_value;
    *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0x314) =
         out_buf._M_extent._M_extent_value._4_4_;
    *(int *)((long)(peVar12->parser_).headers_._M_elems + 0x338) = (int)ctx;
    ((string_view *)((long)(peVar12->parser_).headers_._M_elems + 0x330))->_M_len = (size_t)uri;
    phVar3 = (http_header *)((long)(peVar12->parser_).headers_._M_elems + 0x280);
    ((string_view *)((long)(peVar12->parser_).headers_._M_elems + 0x270))->_M_len = (size_t)phVar3;
    psVar4 = psVar14 + 2;
    if ((size_t *)*psVar14 == psVar4) {
      uVar7 = *(undefined4 *)((long)psVar14 + 0x14);
      sVar10 = psVar14[3];
      uVar8 = *(undefined4 *)((long)psVar14 + 0x1c);
      *(int *)&(phVar3->name)._M_len = (int)*psVar4;
      *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0x284) = uVar7;
      *(int *)((long)(peVar12->parser_).headers_._M_elems + 0x288) = (int)sVar10;
      *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0x28c) = uVar8;
    }
    else {
      ((string_view *)((long)(peVar12->parser_).headers_._M_elems + 0x270))->_M_len = *psVar14;
      (((http_header *)((long)(peVar12->parser_).headers_._M_elems + 0x280))->name)._M_len = *psVar4
      ;
    }
    *(char **)((long)(peVar12->parser_).headers_._M_elems + 0x278) = (char *)psVar14[1];
    *psVar14 = (size_t)psVar4;
    psVar14[1] = 0;
    *(undefined1 *)(psVar14 + 2) = 0;
    *(undefined4 *)
     &(((http_header *)((long)(peVar12->parser_).headers_._M_elems + 0xa0))->name)._M_len =
         *(undefined4 *)&(headers->_M_h)._M_buckets;
    ppcVar13 = (char **)((long)(peVar12->parser_).headers_._M_elems + 0xb8);
    *(char ***)((long)(peVar12->parser_).headers_._M_elems + 0xa8) = ppcVar13;
    pcVar5 = (char *)(headers->_M_h)._M_bucket_count;
    psVar1 = &(headers->_M_h)._M_element_count;
    if ((size_type *)pcVar5 == psVar1) {
      uVar7 = *(undefined4 *)((long)&(headers->_M_h)._M_element_count + 4);
      fVar9 = (headers->_M_h)._M_rehash_policy._M_max_load_factor;
      uVar8 = *(undefined4 *)&(headers->_M_h)._M_rehash_policy.field_0x4;
      *(int *)ppcVar13 = (int)*psVar1;
      *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0xbc) = uVar7;
      *(float *)&(((http_header *)((long)(peVar12->parser_).headers_._M_elems + 0xc0))->name)._M_len
           = fVar9;
      *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0xc4) = uVar8;
    }
    else {
      *(char **)((long)(peVar12->parser_).headers_._M_elems + 0xa8) = pcVar5;
      *(char **)((long)(peVar12->parser_).headers_._M_elems + 0xb8) = (char *)*psVar1;
    }
    ((string_view *)((long)(peVar12->parser_).headers_._M_elems + 0xb0))->_M_len =
         (size_t)(headers->_M_h)._M_before_begin._M_nxt;
    (headers->_M_h)._M_bucket_count = (size_type)psVar1;
    (headers->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    *(undefined1 *)&(headers->_M_h)._M_element_count = 0;
    ppcVar13 = (char **)((long)(peVar12->parser_).headers_._M_elems + 0xd8);
    *(char ***)((long)(peVar12->parser_).headers_._M_elems + 200) = ppcVar13;
    puVar6 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(headers->_M_h)._M_rehash_policy._M_next_resize;
    puVar2 = headers + 1;
    if (puVar6 == puVar2) {
      uVar7 = *(undefined4 *)((long)&headers[1]._M_h._M_buckets + 4);
      sVar11 = headers[1]._M_h._M_bucket_count;
      uVar8 = *(undefined4 *)((long)&headers[1]._M_h._M_bucket_count + 4);
      *(undefined4 *)ppcVar13 = *(undefined4 *)&(puVar2->_M_h)._M_buckets;
      *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0xdc) = uVar7;
      *(int *)&(((http_header *)((long)(peVar12->parser_).headers_._M_elems + 0xe0))->name)._M_len =
           (int)sVar11;
      *(undefined4 *)((long)(peVar12->parser_).headers_._M_elems + 0xe4) = uVar8;
    }
    else {
      *(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        **)((long)(peVar12->parser_).headers_._M_elems + 200) = puVar6;
      *(__buckets_ptr *)((long)(peVar12->parser_).headers_._M_elems + 0xd8) =
           (puVar2->_M_h)._M_buckets;
    }
    ((string_view *)((long)(peVar12->parser_).headers_._M_elems + 0xd0))->_M_len =
         (size_t)(headers->_M_h)._M_single_bucket;
    (headers->_M_h)._M_rehash_policy._M_next_resize = (size_t)puVar2;
    (headers->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    *(undefined1 *)&headers[1]._M_h._M_buckets = 0;
    *(_Hash_node_base **)((long)(peVar12->parser_).headers_._M_elems + 0xe8) =
         headers[1]._M_h._M_before_begin._M_nxt;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)(peVar12->parser_).headers_._M_elems + 0x1c0));
    (peVar12->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar12->parser_ = 0;
    (peVar12->parser_).msg_._M_len = 0;
    *(undefined1 *)
     &(((http_header *)((long)(peVar12->parser_).headers_._M_elems + 0x20))->name)._M_len = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
    *(undefined1 *)((long)(peVar12->parser_).headers_._M_elems + 0x33c) = 0;
  }
  return (LazyBase<cinatra::resp_data,_false>)(LazyBase<cinatra::resp_data,_false>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_request(
      S uri, http_method method, req_context<String> ctx,
      std::unordered_map<std::string, std::string> headers = {},
      std::span<char> out_buf = {}) {
    if (!resp_chunk_str_.empty()) {
      resp_chunk_str_.clear();
    }
    if (!body_.empty()) {
      body_.clear();
    }

    out_buf_ = out_buf;

    std::shared_ptr<int> guard(nullptr, [this](auto) {
      if (!req_headers_.empty()) {
        req_headers_.clear();
      }
    });

    resp_data data{};

    std::error_code ec{};
    size_t size = 0;
    bool is_keep_alive = true;

    do {
      uri_t u;
      std::string append_uri;

      if (socket_->has_closed_ || (!uri.empty() && uri[0] != '/')) {
        bool no_schema = !has_schema(uri);

        if (no_schema) {
#ifdef CINATRA_ENABLE_SSL
          if (is_ssl_schema_) {
            append_uri.append("https://").append(uri);
          }
          else
#endif
          {
            append_uri.append("http://").append(uri);
          }
        }
        bool ok = false;
        std::tie(ok, u) = handle_uri(data, no_schema ? append_uri : uri);
        if (!ok) {
          break;
        }
      }
      else {
        u.path = uri;
      }
      if (socket_->has_closed_) {
        data = co_await connect(u);
        if (data.status != 0) {
          co_return data;
        }
      }

      std::vector<asio::const_buffer> vec;
      std::string req_head_str =
          build_request_header(u, method, ctx, false, std::move(headers));

      bool has_body = !ctx.content.empty();
      if (has_body) {
        vec.push_back(asio::buffer(req_head_str));
        vec.push_back(asio::buffer(ctx.content.data(), ctx.content.size()));
      }

#ifdef CORO_HTTP_PRINT_REQ_HEAD
      CINATRA_LOG_DEBUG << req_head_str;
#endif
      auto guard = timer_guard(this, req_timeout_duration_, "request timer");
      if (has_body) {
        std::tie(ec, size) = co_await async_write(vec);
      }
      else {
        std::tie(ec, size) = co_await async_write(asio::buffer(req_head_str));
      }
      if (ec) {
        break;
      }
      data =
          co_await handle_read(ec, size, is_keep_alive, std::move(ctx), method);
    } while (0);
    if (ec && socket_->is_timeout_) {
      ec = std::make_error_code(std::errc::timed_out);
    }
    handle_result(data, ec, is_keep_alive);
    co_return data;
  }